

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

RegexMatcher *
Catch::Matchers::Matches(RegexMatcher *__return_storage_ptr__,string *regex,Choice caseSensitivity)

{
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,regex);
  StdString::RegexMatcher::RegexMatcher(__return_storage_ptr__,&sStack_38,caseSensitivity);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

StdString::RegexMatcher Matches(std::string const &regex, CaseSensitive::Choice caseSensitivity) {
      return StdString::RegexMatcher(regex, caseSensitivity);
    }